

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cni_namespace_impl::cni_register::cni_register<cs_impl::any>
          (cni_register *this,namespace_t *ns,char *name,any *val)

{
  element_type *var;
  string *in_RDX;
  name_space *this_00;
  undefined1 local_41 [41];
  string *local_18;
  
  local_18 = in_RDX;
  var = std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x419be2);
  this_00 = (name_space *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),(char *)local_18,(allocator *)this_00);
  cs::name_space::add_var(this_00,local_18,(var *)var);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return;
}

Assistant:

cni_register(const cs::namespace_t &ns, const char *name, T &&val)
		{
			ns->add_var(name, std::forward<T>(val));
		}